

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-grib-cursor.c
# Opt level: O3

int coda_grib_cursor_read_float(coda_cursor *cursor,float *dst)

{
  byte bVar1;
  coda_dynamic_type_struct *pcVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  ulong uVar11;
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [11];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [16];
  int iVar24;
  byte *pbVar25;
  sbyte sVar26;
  uint uVar27;
  uint uVar28;
  uchar *v;
  undefined4 *dst_00;
  long lVar29;
  coda_product *product;
  long lVar30;
  byte *pbVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  long lVar35;
  long byte_offset;
  float fVar36;
  double dVar37;
  undefined1 auVar38 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  uint8_t buffer [4];
  undefined8 uStack_70;
  undefined4 local_68;
  undefined4 local_64;
  ulong local_60;
  undefined8 local_58;
  float *local_50;
  long local_48;
  long local_40;
  ulong local_38;
  undefined1 auVar39 [16];
  
  iVar24 = cursor->n;
  if (iVar24 < 2) {
    uStack_70 = (code *)0x156f10;
    __assert_fail("cursor->n > 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-grib-cursor.c"
                  ,0x90,"int coda_grib_cursor_read_float(const coda_cursor *, float *)");
  }
  pcVar2 = cursor->stack[iVar24 - 2].type;
  if (pcVar2->definition->type_class != coda_array_class) {
    uStack_70 = read_bytes;
    __assert_fail("array->definition->type_class == coda_array_class",
                  "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-grib-cursor.c"
                  ,0x92,"int coda_grib_cursor_read_float(const coda_cursor *, float *)");
  }
  uVar34 = cursor->stack[iVar24 - 1].index;
  if (*(int *)&pcVar2[2].definition == 0) {
    uStack_70 = (code *)0x156b73;
    iVar24 = read_bytes((coda_product *)cursor->product[1].filename,
                        (*(long *)(pcVar2 + 2) >> 3) + uVar34 * 4,4,dst);
    if (iVar24 == 0) {
      fVar36 = *dst;
      auVar41 = ZEXT716(CONCAT52(CONCAT41((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)(byte)((
                                                  uint)fVar36 >> 0x18) << 0x30) >> 0x28),
                                                  CONCAT14((char)((uint)fVar36 >> 0x10),fVar36)) >>
                                                  0x20),fVar36) >> 0x18),(char)((uint)fVar36 >> 8)),
                                 (ushort)SUB41(fVar36,0)) & 0xffffff00ffffff);
      auVar41 = pshuflw(auVar41,auVar41,0x1b);
      sVar3 = auVar41._0_2_;
      sVar4 = auVar41._2_2_;
      sVar5 = auVar41._4_2_;
      sVar6 = auVar41._6_2_;
      *dst = (float)CONCAT13((0 < sVar6) * (sVar6 < 0x100) * auVar41[6] - (0xff < sVar6),
                             CONCAT12((0 < sVar5) * (sVar5 < 0x100) * auVar41[4] - (0xff < sVar5),
                                      CONCAT11((0 < sVar4) * (sVar4 < 0x100) * auVar41[2] -
                                               (0xff < sVar4),
                                               (0 < sVar3) * (sVar3 < 0x100) * auVar41[0] -
                                               (0xff < sVar3))));
      return 0;
    }
    return -1;
  }
  local_60 = 0;
  uVar28 = *(uint *)((long)&pcVar2[2].definition + 4);
  uVar32 = (ulong)(int)uVar28;
  if (uVar32 == 0) {
    fVar36 = *(float *)&pcVar2[3].field_0x4;
LAB_00156bbc:
    *dst = fVar36;
  }
  else {
    if (pcVar2[4].definition != (coda_type *)0x0) {
      lVar29 = (long)uVar34 >> 3;
      bVar1 = *(byte *)((long)&(pcVar2[4].definition)->format + lVar29);
      uVar27 = (uint)uVar34 & 7;
      if ((bVar1 >> ((byte)uVar27 ^ 7) & 1) == 0) {
        uStack_70 = (code *)0x156bb8;
        dVar37 = coda_NaN();
        fVar36 = (float)dVar37;
        goto LAB_00156bbc;
      }
      lVar30 = (long)uVar34 >> 7;
      if (lVar30 < 1) {
        uVar33 = 0;
      }
      else {
        pbVar31 = (byte *)(*(long *)(pcVar2 + 5) + 0xf);
        uVar33 = 0;
        do {
          uVar33 = uVar33 + *pbVar31;
          pbVar31 = pbVar31 + 0x10;
          lVar30 = lVar30 + -1;
        } while (lVar30 != 0);
      }
      uVar11 = uVar34 & 0x78;
      uVar34 = uVar33;
      if (uVar11 != 0) {
        uVar34 = uVar33 + *(byte *)(*(long *)(pcVar2 + 5) + -1 + lVar29);
      }
      if ((ulong)uVar27 != 0) {
        lVar29 = 0;
        do {
          uVar34 = uVar34 + ((bVar1 >> ((int)lVar29 + 7U & 0x1f) & 1) != 0);
          lVar29 = lVar29 + -1;
        } while (-lVar29 != (ulong)uVar27);
      }
    }
    lVar30 = (long)(int)(-((int)uVar28 >> 3) - (uint)((uVar28 & 7) != 0));
    pbVar31 = (byte *)((long)&local_58 + lVar30);
    lVar35 = uVar34 * uVar32 + *(long *)(pcVar2 + 2);
    product = (coda_product *)cursor->product[1].filename;
    uVar34 = (ulong)((uint)lVar35 & 7);
    lVar29 = uVar34 + uVar32;
    uVar27 = -(int)lVar29 & 7;
    byte_offset = lVar35 >> 3;
    sVar26 = (sbyte)uVar27;
    local_50 = dst;
    if (lVar29 < 9) {
      uStack_70 = (code *)0x156c53;
      iVar24 = read_bytes(product,byte_offset,1,pbVar31);
      if (iVar24 != 0) {
        return -1;
      }
      if (uVar27 != 0) {
        *pbVar31 = *pbVar31 >> sVar26;
      }
      if ((uVar32 & 7) != 0) {
        *pbVar31 = *pbVar31 & ~(byte)(-1 << ((byte)uVar28 & 0x1f));
      }
    }
    else if (uVar27 == 0) {
      uVar34 = uVar32 & 7;
      if (uVar34 != 0) {
        uStack_70 = (code *)0x156d73;
        iVar24 = read_bytes(product,byte_offset,1,&local_64);
        if (iVar24 != 0) {
          return -1;
        }
        *(byte *)((long)&local_58 + lVar30) = ~(-1 << (sbyte)uVar34) & (byte)local_64;
        pbVar31 = (byte *)((long)&local_58 + lVar30 + 1);
        lVar35 = lVar35 + uVar34;
        uVar32 = uVar32 & 0xfffffffffffffff8;
      }
      if (0 < (long)uVar32) {
        uStack_70 = (code *)0x156dc6;
        iVar24 = read_bytes(product,lVar35 >> 3,uVar32 >> 3,pbVar31);
        if (iVar24 != 0) {
          return -1;
        }
      }
    }
    else {
      uVar28 = uVar28 + (((uint)((int)uVar28 / 6 + ((int)uVar28 >> 0x1f)) >> 2) -
                        ((int)uVar28 >> 0x1f)) * -0x18;
      local_58 = product;
      if (uVar28 != 0) {
        local_38 = (ulong)(int)uVar28;
        uVar34 = uVar34 + local_38;
        local_40 = ((uVar34 >> 3) + 1) - (ulong)((uVar34 & 7) == 0);
        local_48 = ((local_38 >> 3) + 1) - (ulong)((uVar28 & 7) == 0);
        dst_00 = &local_64;
        uStack_70 = (code *)0x156d08;
        iVar24 = read_bytes(product,byte_offset,local_40,dst_00);
        uVar34 = local_38;
        lVar29 = local_48;
        product = local_58;
        if (iVar24 != 0) {
          return -1;
        }
        local_68 = 0;
        if (local_40 != 0) {
          lVar30 = 0;
          do {
            *(undefined1 *)((long)&local_68 + lVar30 + 3) = *(undefined1 *)dst_00;
            lVar30 = lVar30 + -1;
            dst_00 = (undefined4 *)((long)dst_00 + 1);
          } while (-lVar30 != local_40);
        }
        local_68 = ~(-1 << ((byte)local_38 & 0x1f)) & 0U >> (sVar26 + (char)local_40 * -8 & 0x1fU);
        pbVar25 = pbVar31;
        for (lVar30 = local_48; lVar30 != 0; lVar30 = lVar30 + -1) {
          *pbVar25 = *(byte *)((long)&uStack_70 + lVar30 + 7);
          pbVar25 = pbVar25 + 1;
        }
        pbVar31 = pbVar31 + lVar29;
        lVar35 = lVar35 + uVar34;
        uVar32 = uVar32 - uVar34;
      }
      if (0 < (long)uVar32) {
        lVar29 = uVar32 + 0x18;
        do {
          uStack_70 = (code *)0x156e41;
          iVar24 = read_bytes(product,lVar35 >> 3,4,&local_64);
          if (iVar24 != 0) {
            return -1;
          }
          auVar23._1_9_ = SUB169(ZEXT816(0) << 0x40,7);
          auVar23[0] = (char)((uint)local_64 >> 0x18);
          auVar23._10_6_ = 0;
          auVar39._5_11_ = SUB1611(auVar23 << 0x30,5);
          auVar39[4] = (char)((uint)local_64 >> 0x10);
          auVar39._0_4_ = local_64;
          auVar41._12_4_ = 0;
          auVar41._0_12_ = auVar39._4_12_;
          auVar38._3_13_ = SUB1613(auVar41 << 0x20,3);
          auVar38[2] = (char)((uint)local_64 >> 8);
          auVar38[0] = (byte)local_64;
          auVar38[1] = 0;
          auVar41 = pshuflw(auVar38,auVar38,0x1b);
          sVar3 = auVar41._0_2_;
          sVar4 = auVar41._2_2_;
          sVar5 = auVar41._4_2_;
          sVar6 = auVar41._6_2_;
          local_68 = CONCAT13((0 < sVar6) * (sVar6 < 0x100) * auVar41[6] - (0xff < sVar6),
                              CONCAT12((0 < sVar5) * (sVar5 < 0x100) * auVar41[4] - (0xff < sVar5),
                                       CONCAT11((0 < sVar4) * (sVar4 < 0x100) * auVar41[2] -
                                                (0xff < sVar4),
                                                (0 < sVar3) * (sVar3 < 0x100) * auVar41[0] -
                                                (0xff < sVar3)))) >> sVar26;
          *pbVar31 = (byte)(local_68 >> 0x10);
          pbVar31[1] = (byte)(local_68 >> 8);
          pbVar31[2] = (byte)local_68;
          pbVar31 = pbVar31 + 3;
          lVar35 = lVar35 + 0x18;
          lVar29 = lVar29 + -0x18;
          product = local_58;
        } while (0x18 < lVar29);
      }
    }
    auVar12._8_6_ = 0;
    auVar12._0_8_ = local_60;
    auVar12[0xe] = (char)(local_60 >> 0x38);
    auVar13._8_4_ = 0;
    auVar13._0_8_ = local_60;
    auVar13[0xc] = (char)(local_60 >> 0x30);
    auVar13._13_2_ = auVar12._13_2_;
    auVar14._8_4_ = 0;
    auVar14._0_8_ = local_60;
    auVar14._12_3_ = auVar13._12_3_;
    auVar15._8_2_ = 0;
    auVar15._0_8_ = local_60;
    auVar15[10] = (char)(local_60 >> 0x28);
    auVar15._11_4_ = auVar14._11_4_;
    auVar16._8_2_ = 0;
    auVar16._0_8_ = local_60;
    auVar16._10_5_ = auVar15._10_5_;
    auVar17[8] = (char)(local_60 >> 0x20);
    auVar17._0_8_ = local_60;
    auVar17._9_6_ = auVar16._9_6_;
    auVar40[7] = 0;
    auVar40._0_7_ = auVar17._8_7_;
    auVar19._7_8_ = 0;
    auVar19._0_7_ = auVar17._8_7_;
    auVar21._1_8_ = SUB158(auVar19 << 0x40,7);
    auVar21[0] = (char)(local_60 >> 0x18);
    auVar21._9_6_ = 0;
    auVar20._1_10_ = SUB1510(auVar21 << 0x30,5);
    auVar20[0] = (char)(local_60 >> 0x10);
    auVar22._11_4_ = 0;
    auVar22._0_11_ = auVar20;
    auVar18._3_12_ = SUB1512(auVar22 << 0x20,3);
    auVar18[2] = (char)(local_60 >> 8);
    auVar18[1] = 0;
    auVar18[0] = (byte)local_60;
    auVar40._8_4_ = auVar18._0_4_;
    auVar40._12_4_ = auVar20._0_4_;
    auVar41 = pshuflw(auVar40,auVar40,0x1b);
    auVar41 = pshufhw(auVar41,auVar41,0x1b);
    sVar3 = auVar41._0_2_;
    sVar4 = auVar41._2_2_;
    sVar5 = auVar41._4_2_;
    sVar6 = auVar41._6_2_;
    sVar7 = auVar41._8_2_;
    sVar8 = auVar41._10_2_;
    sVar9 = auVar41._12_2_;
    sVar10 = auVar41._14_2_;
    *local_50 = (float)((double)CONCAT17((0 < sVar10) * (sVar10 < 0x100) * auVar41[0xe] -
                                         (0xff < sVar10),
                                         CONCAT16((0 < sVar9) * (sVar9 < 0x100) * auVar41[0xc] -
                                                  (0xff < sVar9),
                                                  CONCAT15((0 < sVar8) * (sVar8 < 0x100) *
                                                           auVar41[10] - (0xff < sVar8),
                                                           CONCAT14((0 < sVar7) * (sVar7 < 0x100) *
                                                                    auVar41[8] - (0xff < sVar7),
                                                                    CONCAT13((0 < sVar6) *
                                                                             (sVar6 < 0x100) *
                                                                             auVar41[6] -
                                                                             (0xff < sVar6),
                                                                             CONCAT12((0 < sVar5) *
                                                                                      (sVar5 < 0x100
                                                                                      ) * auVar41[4]
                                                                                      - (0xff < 
                                                  sVar5),CONCAT11((0 < sVar4) * (sVar4 < 0x100) *
                                                                  auVar41[2] - (0xff < sVar4),
                                                                  (0 < sVar3) * (sVar3 < 0x100) *
                                                                  auVar41[0] - (0xff < sVar3))))))))
                        * (double)pcVar2[3].definition + *(double *)(pcVar2 + 4));
  }
  return 0;
}

Assistant:

int coda_grib_cursor_read_float(const coda_cursor *cursor, float *dst)
{
    coda_grib_value_array *array;
    long index;

    assert(cursor->n > 1);
    array = (coda_grib_value_array *)cursor->stack[cursor->n - 2].type;
    assert(array->definition->type_class == coda_array_class);
    index = cursor->stack[cursor->n - 1].index;
    if (array->simple_packing)
    {
        int64_t ivalue = 0;
        uint8_t *buffer;

        if (array->element_bit_size == 0)
        {
            *((float *)dst) = array->referenceValue;
            return 0;
        }
        if (array->bitmask != NULL)
        {
            uint8_t bm;
            long bm_index;
            long value_index = 0;
            long i;

            bm_index = index >> 3;
            bm = array->bitmask[bm_index];
            if (!((bm >> (7 - (index & 0x7))) & 1))
            {
                /* bitmask value is 0 -> return NaN */
                *((float *)dst) = (float)coda_NaN();
                return 0;
            }

            /* bitmask value is 1 -> update index to be the index in the value array */
            for (i = 0; i < bm_index >> 4; i++)
            {
                /* advance value_index based on cumsum of blocks of 128 bitmap bits (= 16 bytes) */
                value_index += array->bitmask_cumsum128[16 * i + 15];
            }
            if (bm_index % 16 != 0)
            {
                value_index += array->bitmask_cumsum128[bm_index - 1];
            }
            bm = array->bitmask[bm_index];
            for (i = 0; i < (index & 0x7); i++)
            {
                value_index += (bm >> (7 - i)) & 1;
            }
            index = value_index;
        }
        buffer = &((uint8_t *)&ivalue)[8 - bit_size_to_byte_size(array->element_bit_size)];
        if (read_bits(((coda_grib_product *)cursor->product)->raw_product,
                      array->bit_offset + index * array->element_bit_size, array->element_bit_size, buffer) != 0)
        {
            return -1;
        }
#ifndef WORDS_BIGENDIAN
        swap8(&ivalue);
#endif
        *((float *)dst) = (float)(ivalue * array->scalefactor + array->offset);
    }
    else
    {
        if (read_bytes(((coda_grib_product *)cursor->product)->raw_product, (array->bit_offset >> 3) + index * 4, 4,
                       dst) != 0)
        {
            return -1;
        }
#ifndef WORDS_BIGENDIAN
        swap_float(dst);
#endif
    }

    return 0;
}